

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_call(jit_State *J,IRCallID id,...)

{
  undefined4 uVar1;
  char in_AL;
  TRef TVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined4 *local_158;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  uint local_68;
  undefined4 local_64;
  va_list argp;
  TRef local_48;
  uint local_44;
  TRef tr;
  uint32_t n;
  CCallInfo *ci;
  IRCallID id_local;
  jit_State *J_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_44 = lj_ir_callinfo[id].flags & 0xff;
  local_48 = 0x7fff;
  argp[0].overflow_arg_area = local_118;
  argp[0]._0_8_ = &stack0x00000008;
  local_68 = 0x10;
  if ((lj_ir_callinfo[id].flags & 0x100) != 0) {
    local_44 = local_44 - 1;
  }
  if (local_44 != 0) {
    local_68 = 0x18;
    local_48 = (TRef)local_108;
  }
  local_64 = 0x30;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  while( true ) {
    if (local_44 < 2) break;
    if (local_68 < 0x29) {
      local_158 = (undefined4 *)((long)(int)local_68 + (long)argp[0].overflow_arg_area);
      local_68 = local_68 + 8;
    }
    else {
      local_158 = (undefined4 *)argp[0]._0_8_;
      argp[0]._0_8_ = argp[0]._0_8_ + 8;
    }
    uVar1 = *local_158;
    (J->fold).ins.field_0.ot = 0x6400;
    (J->fold).ins.field_0.op1 = (IRRef1)local_48;
    (J->fold).ins.field_0.op2 = (IRRef1)uVar1;
    local_48 = lj_opt_fold(J);
    local_44 = local_44 - 1;
  }
  if (lj_ir_callinfo[id].flags >> 0x18 == 0x62) {
    J->needsnap = '\x01';
  }
  ci._4_2_ = (IRRef1)id;
  (J->fold).ins.field_0.ot = *(IROpT *)((long)&lj_ir_callinfo[id].flags + 2);
  (J->fold).ins.field_0.op1 = (IRRef1)local_48;
  (J->fold).ins.field_0.op2 = ci._4_2_;
  TVar2 = lj_opt_fold(J);
  return TVar2;
}

Assistant:

TRef lj_ir_call(jit_State *J, IRCallID id, ...)
{
  const CCallInfo *ci = &lj_ir_callinfo[id];
  uint32_t n = CCI_NARGS(ci);
  TRef tr = TREF_NIL;
  va_list argp;
  va_start(argp, id);
  if ((ci->flags & CCI_L)) n--;
  if (n > 0)
    tr = va_arg(argp, IRRef);
  while (n-- > 1)
    tr = emitir(IRT(IR_CARG, IRT_NIL), tr, va_arg(argp, IRRef));
  va_end(argp);
  if (CCI_OP(ci) == IR_CALLS)
    J->needsnap = 1;  /* Need snapshot after call with side effect. */
  return emitir(CCI_OPTYPE(ci), tr, id);
}